

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall
HModel::util_reportRowMtx
          (HModel *this,int nrow,vector<int,_std::allocator<int>_> *XARstart,
          vector<int,_std::allocator<int>_> *XARindex,
          vector<double,_std::allocator<double>_> *XARvalue)

{
  int *piVar1;
  pointer piVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < nrow) {
    puts("Row    Index       Value");
    uVar3 = 0;
    while (piVar2 = (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start, uVar3 != (uint)nrow) {
      printf("%6d Start %8d\n",uVar3 & 0xffffffff,(ulong)(uint)piVar2[uVar3]);
      piVar2 = (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = piVar2 + uVar3;
      uVar3 = uVar3 + 1;
      for (lVar4 = (long)*piVar1; lVar4 < piVar2[uVar3]; lVar4 = lVar4 + 1) {
        printf("      %6d %11g\n",
               (XARvalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar4],
               (ulong)(uint)(XARindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar4]);
        piVar2 = (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    printf("       Start %8d\n",(ulong)(uint)piVar2[(uint)nrow]);
    return;
  }
  return;
}

Assistant:

void HModel::util_reportRowMtx(int nrow, vector<int>& XARstart, vector<int>& XARindex, vector<double>& XARvalue) {
  // Report the row-wise matrix passed to the method
  if (nrow <= 0) return;
  printf("Row    Index       Value\n");
  for (int row = 0; row < nrow; row++) {
    printf("%6d Start %8d\n", row, XARstart[row]);
    for (int el = XARstart[row]; el < XARstart[row+1]; el++) {
      printf("      %6d %11g\n", XARindex[el], XARvalue[el]);
    }
  }
    printf("       Start %8d\n", XARstart[nrow]);
}